

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementCableANCF::ComputeInternalForces_Impl(chrono::ChVector<double>const&,chrono::
ChVector<double>const&,chrono::ChVector<double>const&,chrono::ChVector<double>const&,chrono::
ChVector<double>const&,chrono::ChVector<double>const&,chrono::ChVector<double>const&,chrono::
ChVector<double>const&,Eigen::Matrix<double,-1,1,0,-1,1>&)::CableANCF_ForceCurv::Evaluate(Eigen::
Matrix<double,12,1,0,12,1>__double_(void *this,ChVectorN<double,_12> *result,double x)

{
  long lVar1;
  undefined8 uVar2;
  double *pdVar3;
  int i;
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  int i_1;
  ActualDstType actualDst_5;
  ActualDstType actualDst_2;
  ActualDstType actualDst;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar9;
  undefined1 auVar15 [32];
  double dVar10;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar16 [64];
  undefined1 extraout_var [56];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar27;
  undefined1 auVar23 [16];
  double dVar28;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar37;
  double dVar38;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  ChVector<double> vr_x;
  ChVector<double> vr_xx;
  double local_e8;
  long lStack_e0;
  ChVector<double> local_b0;
  undefined1 local_98 [16];
  double local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ChVector<double> local_48;
  
  local_98._8_8_ = local_98._0_8_;
  local_98._0_8_ = x;
  lVar6 = (long)this + 0x260;
  (**(code **)(**(long **)((long)this + 8) + 0xe0))(*(long **)((long)this + 8),lVar6);
  lVar1 = (long)this + 0x280;
  (**(code **)(**(long **)((long)this + 8) + 0xe8))(local_98._0_8_,*(long **)((long)this + 8),lVar1)
  ;
  puVar5 = (undefined8 *)((long)this + 0x20);
  *(undefined8 *)((long)this + 0x100) = 0;
  *(undefined8 *)((long)this + 0x108) = 0;
  *(undefined8 *)((long)this + 0x110) = 0;
  *(undefined8 *)((long)this + 0x118) = 0;
  *(undefined8 *)((long)this + 0x120) = 0;
  *(undefined8 *)((long)this + 0x128) = 0;
  *(undefined8 *)((long)this + 0x130) = 0;
  *(undefined8 *)((long)this + 0x138) = 0;
  *(undefined8 *)((long)this + 0xe0) = 0;
  *(undefined8 *)((long)this + 0xe8) = 0;
  *(undefined8 *)((long)this + 0xf0) = 0;
  *(undefined8 *)((long)this + 0xf8) = 0;
  *(undefined8 *)((long)this + 0x100) = 0;
  *(undefined8 *)((long)this + 0x108) = 0;
  *(undefined8 *)((long)this + 0x110) = 0;
  *(undefined8 *)((long)this + 0x118) = 0;
  *(undefined8 *)((long)this + 0xa0) = 0;
  *(undefined8 *)((long)this + 0xa8) = 0;
  *(undefined8 *)((long)this + 0xb0) = 0;
  *(undefined8 *)((long)this + 0xb8) = 0;
  *(undefined8 *)((long)this + 0xc0) = 0;
  *(undefined8 *)((long)this + 200) = 0;
  *(undefined8 *)((long)this + 0xd0) = 0;
  *(undefined8 *)((long)this + 0xd8) = 0;
  *(undefined8 *)((long)this + 0x60) = 0;
  *(undefined8 *)((long)this + 0x68) = 0;
  *(undefined8 *)((long)this + 0x70) = 0;
  *(undefined8 *)((long)this + 0x78) = 0;
  *(undefined8 *)((long)this + 0x80) = 0;
  *(undefined8 *)((long)this + 0x88) = 0;
  *(undefined8 *)((long)this + 0x90) = 0;
  *(undefined8 *)((long)this + 0x98) = 0;
  *(undefined8 *)((long)this + 0x20) = 0;
  *(undefined8 *)((long)this + 0x28) = 0;
  *(undefined8 *)((long)this + 0x30) = 0;
  *(undefined8 *)((long)this + 0x38) = 0;
  *(undefined8 *)((long)this + 0x40) = 0;
  *(undefined8 *)((long)this + 0x48) = 0;
  *(undefined8 *)((long)this + 0x50) = 0;
  *(undefined8 *)((long)this + 0x58) = 0;
  lVar4 = 0;
  do {
    *puVar5 = *(undefined8 *)(lVar6 + lVar4 * 8);
    uVar2 = *(undefined8 *)(lVar6 + lVar4 * 8);
    puVar5[0xd] = uVar2;
    puVar5[0x1a] = uVar2;
    lVar4 = lVar4 + 1;
    puVar5 = puVar5 + 3;
  } while (lVar4 != 4);
  puVar5 = (undefined8 *)((long)this + 0x140);
  auVar16 = ZEXT864(0) << 0x20;
  *(undefined1 (*) [64])((long)this + 0x220) = auVar16;
  *(undefined1 (*) [64])((long)this + 0x200) = auVar16;
  *(undefined1 (*) [64])((long)this + 0x1c0) = auVar16;
  *(undefined1 (*) [64])((long)this + 0x180) = auVar16;
  *(undefined1 (*) [64])((long)this + 0x140) = auVar16;
  lVar4 = 0;
  do {
    *puVar5 = *(undefined8 *)(lVar1 + lVar4 * 8);
    uVar2 = *(undefined8 *)(lVar1 + lVar4 * 8);
    puVar5[0xd] = uVar2;
    puVar5[0x1a] = uVar2;
    lVar4 = lVar4 + 1;
    puVar5 = puVar5 + 3;
  } while (lVar4 != 4);
  local_e8 = *(double *)((long)this + 0x10);
  lStack_e0 = lVar6;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,4,3,1,4,3>>,Eigen::Transpose<Eigen::Matrix<double,1,4,1,1,4>>,0>>
            (&local_b0,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_4,_3,_1,_4,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_0>_>
              *)&local_e8,(type *)0x0);
  lStack_e0 = lVar1;
  local_e8 = (double)*(undefined8 *)((long)this + 0x10);
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,4,3,1,4,3>>,Eigen::Transpose<Eigen::Matrix<double,1,4,1,1,4>>,0>>
            (&local_48,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_4,_3,_1,_4,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_0>_>
              *)&local_e8,(type *)0x0);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_b0.m_data[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_b0.m_data[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_48.m_data[2];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_b0.m_data[2];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_48.m_data[0];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_48.m_data[1];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_48.m_data[1] * local_b0.m_data[2];
  local_68 = vfmsub231sd_fma(auVar61,auVar21,auVar7);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_48.m_data[2] * local_b0.m_data[0];
  local_78 = vfmsub231sd_fma(auVar30,auVar47,auVar39);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_48.m_data[0] * local_b0.m_data[1];
  local_58 = vfmsub231sd_fma(auVar8,auVar11,auVar54);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_78._0_8_ * local_78._0_8_;
  auVar11 = vfmadd231sd_fma(auVar12,local_68,local_68);
  auVar11 = vfmadd231sd_fma(auVar11,local_58,local_58);
  if (auVar11._0_8_ < 0.0) {
    auVar16._0_8_ = sqrt(auVar11._0_8_);
    auVar16._8_56_ = extraout_var;
    local_98 = auVar16._0_16_;
  }
  else {
    local_98 = vsqrtsd_avx(auVar11,auVar11);
  }
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_b0.m_data[0];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_b0.m_data[1] * local_b0.m_data[1];
  auVar11 = vfmadd231sd_fma(auVar22,auVar13,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_b0.m_data[2];
  auVar11 = vfmadd213sd_fma(auVar14,auVar14,auVar11);
  if (auVar11._0_8_ < 0.0) {
    local_80 = sqrt(auVar11._0_8_);
  }
  else {
    auVar11 = vsqrtsd_avx(auVar11,auVar11);
    local_80 = auVar11._0_8_;
  }
  dVar9 = pow(local_80,3.0);
  local_80 = local_80 * 3.0;
  pdVar3 = *(double **)((long)this + 0x10);
  dVar10 = local_80 * *(double *)((long)this + 0x260);
  auVar40._0_8_ = dVar10 * *pdVar3;
  auVar40._8_8_ = dVar10 * pdVar3[1];
  dVar17 = local_80 * *(double *)((long)this + 0x268);
  auVar55._8_8_ = dVar17;
  auVar55._0_8_ = dVar17;
  auVar11 = vfmadd132pd_fma(auVar55,auVar40,*(undefined1 (*) [16])(pdVar3 + 3));
  dVar18 = local_80 * *(double *)((long)this + 0x270);
  auVar62._8_8_ = dVar18;
  auVar62._0_8_ = dVar18;
  auVar11 = vfmadd132pd_fma(auVar62,auVar11,*(undefined1 (*) [16])(pdVar3 + 6));
  local_80 = local_80 * *(double *)((long)this + 0x278);
  auVar56._8_8_ = local_80;
  auVar56._0_8_ = local_80;
  auVar11 = vfmadd132pd_fma(auVar56,auVar11,*(undefined1 (*) [16])(pdVar3 + 9));
  dVar10 = dVar10 * pdVar3[2] + dVar17 * pdVar3[5] + dVar18 * pdVar3[8] + local_80 * pdVar3[0xb];
  local_e8 = auVar11._0_8_;
  lStack_e0 = auVar11._8_8_;
  auVar50._8_8_ = lStack_e0;
  auVar50._0_8_ = lStack_e0;
  auVar50._16_8_ = lStack_e0;
  auVar50._24_8_ = lStack_e0;
  auVar24._0_8_ = local_e8 * *(double *)((long)this + 0x20);
  auVar24._8_8_ = local_e8 * *(double *)((long)this + 0x28);
  auVar24._16_8_ = local_e8 * *(double *)((long)this + 0x30);
  auVar24._24_8_ = local_e8 * *(double *)((long)this + 0x38);
  auVar11 = vfmadd231pd_fma(auVar24,*(undefined1 (*) [32])((long)this + 0x80),auVar50);
  auVar32._8_8_ = dVar10;
  auVar32._0_8_ = dVar10;
  auVar32._16_8_ = dVar10;
  auVar32._24_8_ = dVar10;
  auVar11 = vfmadd231pd_fma(ZEXT1632(auVar11),*(undefined1 (*) [32])((long)this + 0xe0),auVar32);
  auVar58._0_8_ = local_e8 * *(double *)((long)this + 0x40);
  auVar58._8_8_ = local_e8 * *(double *)((long)this + 0x48);
  auVar58._16_8_ = local_e8 * *(double *)((long)this + 0x50);
  auVar58._24_8_ = local_e8 * *(double *)((long)this + 0x58);
  auVar12 = vfmadd231pd_fma(auVar58,*(undefined1 (*) [32])((long)this + 0xa0),auVar50);
  auVar12 = vfmadd231pd_fma(ZEXT1632(auVar12),*(undefined1 (*) [32])((long)this + 0x100),auVar32);
  auVar43._0_8_ = local_e8 * *(double *)((long)this + 0x60);
  auVar43._8_8_ = local_e8 * *(double *)((long)this + 0x68);
  auVar43._16_8_ = local_e8 * *(double *)((long)this + 0x70);
  auVar43._24_8_ = local_e8 * *(double *)((long)this + 0x78);
  auVar21 = vfmadd231pd_fma(auVar43,*(undefined1 (*) [32])((long)this + 0xc0),auVar50);
  auVar21 = vfmadd231pd_fma(ZEXT1632(auVar21),*(undefined1 (*) [32])((long)this + 0x120),auVar32);
  *(undefined1 (*) [32])((long)this + 0x2a0) = ZEXT1632(auVar11);
  *(undefined1 (*) [32])((long)this + 0x2c0) = ZEXT1632(auVar12);
  *(undefined1 (*) [32])((long)this + 0x2e0) = ZEXT1632(auVar21);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_48.m_data[0];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_48.m_data[1];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_48.m_data[2];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_b0.m_data[0];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_b0.m_data[1];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = local_b0.m_data[2];
  auVar66._0_8_ = -local_b0.m_data[2];
  auVar66._8_8_ = 0x8000000000000000;
  auVar67._0_8_ = -local_b0.m_data[0];
  auVar67._8_8_ = 0x8000000000000000;
  lVar6 = -0xc;
  do {
    dVar10 = *(double *)((long)this + lVar6 * 8 + 0x80);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar10;
    dVar17 = *(double *)((long)this + lVar6 * 8 + 0xe0);
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar17;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = dVar17 * local_48.m_data[0];
    auVar21 = vfmsub231sd_fma(auVar74,auVar69,auVar41);
    dVar17 = *(double *)((long)this + lVar6 * 8 + 0x140);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = dVar17;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = dVar10 * local_48.m_data[2];
    auVar12 = vfmsub231sd_fma(auVar70,auVar75,auVar31);
    auVar76._8_8_ = 0;
    auVar76._0_8_ = dVar17 * local_48.m_data[1];
    auVar8 = vfmsub231sd_fma(auVar76,auVar48,auVar71);
    dVar10 = *(double *)((long)this + lVar6 * 8 + 0x1a0);
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar10;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = *(ulong *)((long)this + lVar6 * 8 + 0x200);
    auVar7 = vmulsd_avx512f(auVar77,auVar66);
    auVar78._8_8_ = 0;
    auVar78._0_8_ = *(ulong *)((long)this + lVar6 * 8 + 0x260);
    auVar7 = vfmadd231sd_avx512f(auVar7,auVar63,auVar78);
    auVar8 = vaddsd_avx512f(auVar8,auVar7);
    auVar7 = vmulsd_avx512f(auVar78,auVar67);
    auVar7 = vfmadd231sd_avx512f(auVar7,auVar65,auVar72);
    auVar7 = vaddsd_avx512f(auVar12,auVar7);
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar10 * -local_b0.m_data[1];
    auVar12 = vfmadd231sd_fma(auVar73,auVar57,auVar77);
    *(long *)((long)this + lVar6 * 8 + 0x420) = auVar8._0_8_;
    *(long *)((long)this + lVar6 * 8 + 0x480) = auVar7._0_8_;
    *(double *)((long)this + lVar6 * 8 + 0x4e0) = auVar21._0_8_ + auVar12._0_8_;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0);
  if (((double)local_98._0_8_ != 0.0) || (NAN((double)local_98._0_8_))) {
    auVar12 = vunpcklpd_avx(local_68,local_78);
    dVar10 = 1.0 / (double)local_98._0_8_;
    dVar17 = auVar12._0_8_ * dVar10;
    dVar18 = auVar12._8_8_ * dVar10;
    dVar10 = dVar10 * (double)local_58._0_8_;
    auVar60._8_8_ = dVar18;
    auVar60._0_8_ = dVar18;
    auVar60._16_8_ = dVar18;
    auVar60._24_8_ = dVar18;
    auVar52._0_8_ = dVar17 * *(double *)((long)this + 0x3c0);
    auVar52._8_8_ = dVar17 * *(double *)((long)this + 0x3c8);
    auVar52._16_8_ = dVar17 * *(double *)((long)this + 0x3d0);
    auVar52._24_8_ = dVar17 * *(double *)((long)this + 0x3d8);
    auVar12 = vfmadd231pd_fma(auVar52,*(undefined1 (*) [32])((long)this + 0x420),auVar60);
    auVar64._8_8_ = dVar10;
    auVar64._0_8_ = dVar10;
    auVar64._16_8_ = dVar10;
    auVar64._24_8_ = dVar10;
    auVar8 = vfmadd231pd_fma(ZEXT1632(auVar12),*(undefined1 (*) [32])((long)this + 0x480),auVar64);
    auVar34._0_8_ = dVar17 * *(double *)((long)this + 0x3e0);
    auVar34._8_8_ = dVar17 * *(double *)((long)this + 1000);
    auVar34._16_8_ = dVar17 * *(double *)((long)this + 0x3f0);
    auVar34._24_8_ = dVar17 * *(double *)((long)this + 0x3f8);
    auVar12 = vfmadd231pd_fma(auVar34,*(undefined1 (*) [32])((long)this + 0x440),auVar60);
    auVar21 = vfmadd231pd_fma(ZEXT1632(auVar12),*(undefined1 (*) [32])((long)this + 0x4a0),auVar64);
    auVar45._0_8_ = dVar17 * *(double *)((long)this + 0x400);
    auVar45._8_8_ = dVar17 * *(double *)((long)this + 0x408);
    auVar45._16_8_ = dVar17 * *(double *)((long)this + 0x410);
    auVar45._24_8_ = dVar17 * *(double *)((long)this + 0x418);
    auVar12 = vfmadd231pd_fma(auVar45,*(undefined1 (*) [32])((long)this + 0x460),auVar60);
    auVar12 = vfmadd231pd_fma(ZEXT1632(auVar12),*(undefined1 (*) [32])((long)this + 0x4c0),auVar64);
  }
  else {
    auVar51._0_8_ = (double)local_68._0_8_ * *(double *)((long)this + 0x3c0);
    auVar51._8_8_ = (double)local_68._0_8_ * *(double *)((long)this + 0x3c8);
    auVar51._16_8_ = (double)local_68._0_8_ * *(double *)((long)this + 0x3d0);
    auVar51._24_8_ = (double)local_68._0_8_ * *(double *)((long)this + 0x3d8);
    auVar59._8_8_ = local_78._0_8_;
    auVar59._0_8_ = local_78._0_8_;
    auVar59._16_8_ = local_78._0_8_;
    auVar59._24_8_ = local_78._0_8_;
    auVar12 = vfmadd231pd_fma(auVar51,*(undefined1 (*) [32])((long)this + 0x420),auVar59);
    auVar68._8_8_ = local_58._0_8_;
    auVar68._0_8_ = local_58._0_8_;
    auVar68._16_8_ = local_58._0_8_;
    auVar68._24_8_ = local_58._0_8_;
    auVar8 = vfmadd231pd_fma(ZEXT1632(auVar12),*(undefined1 (*) [32])((long)this + 0x480),auVar68);
    auVar33._0_8_ = (double)local_68._0_8_ * *(double *)((long)this + 0x3e0);
    auVar33._8_8_ = (double)local_68._0_8_ * *(double *)((long)this + 1000);
    auVar33._16_8_ = (double)local_68._0_8_ * *(double *)((long)this + 0x3f0);
    auVar33._24_8_ = (double)local_68._0_8_ * *(double *)((long)this + 0x3f8);
    auVar12 = vfmadd231pd_fma(auVar33,*(undefined1 (*) [32])((long)this + 0x440),auVar59);
    auVar21 = vfmadd231pd_fma(ZEXT1632(auVar12),*(undefined1 (*) [32])((long)this + 0x4a0),auVar68);
    auVar44._0_8_ = (double)local_68._0_8_ * *(double *)((long)this + 0x400);
    auVar44._8_8_ = (double)local_68._0_8_ * *(double *)((long)this + 0x408);
    auVar44._16_8_ = (double)local_68._0_8_ * *(double *)((long)this + 0x410);
    auVar44._24_8_ = (double)local_68._0_8_ * *(double *)((long)this + 0x418);
    auVar12 = vfmadd231pd_fma(auVar44,*(undefined1 (*) [32])((long)this + 0x460),auVar59);
    auVar12 = vfmadd231pd_fma(ZEXT1632(auVar12),*(undefined1 (*) [32])((long)this + 0x4c0),auVar68);
  }
  *(undefined1 (*) [32])((long)this + 0x300) = ZEXT1632(auVar8);
  auVar49._0_8_ = (double)local_98._0_8_ / dVar9;
  auVar49._8_8_ = local_98._8_8_;
  *(undefined1 (*) [32])((long)this + 800) = ZEXT1632(auVar21);
  *(undefined1 (*) [32])((long)this + 0x340) = ZEXT1632(auVar12);
  dVar53 = 1.0 / (dVar9 * dVar9);
  auVar15._0_8_ = dVar9 * *(double *)((long)this + 0x300);
  auVar15._8_8_ = dVar9 * *(double *)((long)this + 0x308);
  auVar15._16_8_ = dVar9 * *(double *)((long)this + 0x310);
  auVar15._24_8_ = dVar9 * *(double *)((long)this + 0x318);
  auVar25._0_8_ = (double)local_98._0_8_ * auVar11._0_8_;
  auVar25._8_8_ = (double)local_98._0_8_ * auVar11._8_8_;
  auVar25._16_8_ = (double)local_98._0_8_ * 0.0;
  auVar25._24_8_ = (double)local_98._0_8_ * 0.0;
  auVar24 = vsubpd_avx(auVar15,auVar25);
  dVar10 = dVar53 * auVar24._0_8_;
  dVar17 = dVar53 * auVar24._8_8_;
  dVar18 = dVar53 * auVar24._16_8_;
  dVar19 = dVar53 * auVar24._24_8_;
  *(double *)((long)this + 0x360) = dVar10;
  *(double *)((long)this + 0x368) = dVar17;
  *(double *)((long)this + 0x370) = dVar18;
  *(double *)((long)this + 0x378) = dVar19;
  auVar26._0_8_ = dVar9 * auVar21._0_8_;
  auVar26._8_8_ = dVar9 * auVar21._8_8_;
  auVar26._16_8_ = dVar9 * 0.0;
  auVar26._24_8_ = dVar9 * 0.0;
  auVar35._0_8_ = (double)local_98._0_8_ * *(double *)((long)this + 0x2c0);
  auVar35._8_8_ = (double)local_98._0_8_ * *(double *)((long)this + 0x2c8);
  auVar35._16_8_ = (double)local_98._0_8_ * *(double *)((long)this + 0x2d0);
  auVar35._24_8_ = (double)local_98._0_8_ * *(double *)((long)this + 0x2d8);
  auVar24 = vsubpd_avx(auVar26,auVar35);
  dVar20 = dVar53 * auVar24._0_8_;
  dVar27 = dVar53 * auVar24._8_8_;
  dVar28 = dVar53 * auVar24._16_8_;
  dVar29 = dVar53 * auVar24._24_8_;
  *(double *)((long)this + 0x380) = dVar20;
  *(double *)((long)this + 0x388) = dVar27;
  *(double *)((long)this + 0x390) = dVar28;
  *(double *)((long)this + 0x398) = dVar29;
  auVar36._0_8_ = dVar9 * auVar12._0_8_;
  auVar36._8_8_ = dVar9 * auVar12._8_8_;
  auVar36._16_8_ = dVar9 * 0.0;
  auVar36._24_8_ = dVar9 * 0.0;
  auVar46._0_8_ = (double)local_98._0_8_ * *(double *)((long)this + 0x2e0);
  auVar46._8_8_ = (double)local_98._0_8_ * *(double *)((long)this + 0x2e8);
  auVar46._16_8_ = (double)local_98._0_8_ * *(double *)((long)this + 0x2f0);
  auVar46._24_8_ = (double)local_98._0_8_ * *(double *)((long)this + 0x2f8);
  auVar24 = vsubpd_avx(auVar36,auVar46);
  dVar9 = dVar53 * auVar24._0_8_;
  dVar37 = dVar53 * auVar24._8_8_;
  dVar38 = dVar53 * auVar24._16_8_;
  dVar53 = dVar53 * auVar24._24_8_;
  *(double *)((long)this + 0x3a0) = dVar9;
  *(double *)((long)this + 0x3a8) = dVar37;
  *(double *)((long)this + 0x3b0) = dVar38;
  *(double *)((long)this + 0x3b8) = dVar53;
  if (*(char *)(*(long *)((long)this + 8) + 0x60) == '\x01') {
    auVar42._8_8_ = 0;
    auVar42._0_8_ = *(ulong *)(*(long *)((long)this + 8) + 0x68);
    pdVar3 = *(double **)((long)this + 0x18);
    dVar9 = dVar10 * *pdVar3 + dVar20 * pdVar3[4] + dVar9 * pdVar3[8] +
            dVar18 * pdVar3[2] + dVar28 * pdVar3[6] + dVar38 * pdVar3[10];
    dVar20 = dVar17 * pdVar3[1] + dVar27 * pdVar3[5] + dVar37 * pdVar3[9] +
             dVar19 * pdVar3[3] + dVar29 * pdVar3[7] + dVar53 * pdVar3[0xb];
    auVar23._0_8_ = dVar9 + dVar20;
    auVar23._8_8_ = dVar9 + dVar20;
    auVar11 = vfmadd231sd_fma(auVar49,auVar42,auVar23);
    auVar49._0_8_ = auVar11._0_8_;
  }
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[0]
       = dVar10 * auVar49._0_8_;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[1]
       = dVar17 * auVar49._0_8_;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[2]
       = dVar18 * auVar49._0_8_;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[3]
       = dVar19 * auVar49._0_8_;
  dVar10 = *(double *)((long)this + 0x388);
  dVar17 = *(double *)((long)this + 0x390);
  dVar18 = *(double *)((long)this + 0x398);
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[4]
       = auVar49._0_8_ * *(double *)((long)this + 0x380);
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[5]
       = auVar49._0_8_ * dVar10;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[6]
       = auVar49._0_8_ * dVar17;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[7]
       = auVar49._0_8_ * dVar18;
  dVar10 = *(double *)((long)this + 0x3a8);
  dVar17 = *(double *)((long)this + 0x3b0);
  dVar18 = *(double *)((long)this + 0x3b8);
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[8]
       = auVar49._0_8_ * *(double *)((long)this + 0x3a0);
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[9]
       = auVar49._0_8_ * dVar10;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array
  [10] = auVar49._0_8_ * dVar17;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array
  [0xb] = auVar49._0_8_ * dVar18;
  return;
}

Assistant:

virtual void Evaluate(ChVectorN<double, 12>& result, const double x) override {
            element->ShapeFunctionsDerivatives(Nd, x);
            element->ShapeFunctionsDerivatives2(Ndd, x);

            // Sd=[Nd1*eye(3) Nd2*eye(3) Nd3*eye(3) Nd4*eye(3)]
            // Sdd=[Ndd1*eye(3) Ndd2*eye(3) Ndd3*eye(3) Ndd4*eye(3)]
            Sd.setZero();
            for (int i = 0; i < 4; i++) {
                Sd(0, 3 * i + 0) = Nd(i);
                Sd(1, 3 * i + 1) = Nd(i);
                Sd(2, 3 * i + 2) = Nd(i);
            }

            Sdd.setZero();
            for (int i = 0; i < 4; i++) {
                Sdd(0, 3 * i + 0) = Ndd(i);
                Sdd(1, 3 * i + 1) = Ndd(i);
                Sdd(2, 3 * i + 2) = Ndd(i);
            }

            ChVector<> vr_x((*d).transpose() * Nd.transpose());
            ChVector<> vr_xx((*d).transpose() * Ndd.transpose());
            ChVector<> vf1 = Vcross(vr_x, vr_xx);
            double f = vf1.Length();
            double g1 = vr_x.Length();
            double g = pow(g1, 3);
            double k = f / g;

            g_e = (3 * g1) * Nd * (*d) * Sd;

            // do:  fe1=cross(Sd,r_xxrep)+cross(r_xrep,Sdd);
            for (int col = 0; col < 12; ++col) {
                ChVector<> Sd_i = Sd.col(col);
                fe1.col(col) = Vcross(Sd_i, vr_xx).eigen();
                ChVector<> Sdd_i = Sdd.col(col);
                fe1.col(col) += Vcross(vr_x, Sdd_i).eigen();
            }
            ChVectorN<double, 3> f1 = vf1.eigen();

            if (f == 0)
                f_e = f1.transpose() * fe1;
            else {
                f_e = (1 / f) * f1.transpose() * fe1;
            }

            k_e = (f_e * g - g_e * f) * (1 / (pow(g, 2)));

            // Add damping if selected by user: curvature rate
            if (element->m_use_damping)
                k += (element->m_alpha) * (k_e * (*d_dt))(0, 0);

            result = k * k_e.transpose();
        }